

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  CURLUcode CVar4;
  ulong in_RAX;
  char *pcVar5;
  byte bVar6;
  CURLcode CVar7;
  _Bool netrc_passwd_changed;
  _Bool netrc_user_changed;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = (undefined4)in_RAX;
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) && (((conn->bits).field_0x4 & 0x80) != 0)) {
    bVar6 = *userp != (char *)0x0;
    if ((bool)bVar6) {
      in_RAX = (*Curl_cfree)(*userp);
      *userp = (char *)0x0;
    }
    pcVar5 = *passwdp;
    uStack_38 = CONCAT44((int)CONCAT71((int7)(in_RAX >> 8),pcVar5 != (char *)0x0),
                         (undefined4)uStack_38);
    if (pcVar5 != (char *)0x0) {
      (*Curl_cfree)(pcVar5);
      *passwdp = (char *)0x0;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0x7f;
  }
  else {
    bVar6 = false;
    uStack_38 = in_RAX & 0xffffffff;
  }
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*userp);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *userp = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    bVar6 = true;
  }
  if ((data->set).str[0x2d] != (char *)0x0) {
    (*Curl_cfree)(*passwdp);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *passwdp = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    uStack_38 = CONCAT44((int)CONCAT71((int7)((ulong)pcVar5 >> 8),1),(undefined4)uStack_38);
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(*optionsp);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2e]);
    *optionsp = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  puVar1 = &(conn->bits).field_0x6;
  *puVar1 = *puVar1 & 0xef;
  if (((data->set).use_netrc != CURL_NETRC_IGNORED) &&
     ((((*userp == (char *)0x0 || (**userp == '\0')) || (*passwdp == (char *)0x0)) ||
      (**passwdp == '\0')))) {
    uStack_38 = uStack_38 & 0xffffffff0000ffff;
    iVar3 = Curl_parsenetrc((conn->host).name,userp,passwdp,(_Bool *)((long)&uStack_38 + 3),
                            (_Bool *)((long)&uStack_38 + 2),(data->set).str[0x14]);
    if (iVar3 < 1) {
      if (iVar3 < 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      puVar1 = &(conn->bits).field_0x4;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x100080;
      bVar6 = bVar6 | uStack_38._3_1_;
      bVar2 = (byte)(uStack_38 >> 0x20) | uStack_38._2_1_;
      uStack_38 = CONCAT44(CONCAT31((int3)(uStack_38 >> 0x28),bVar2),(undefined4)uStack_38);
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
    }
  }
  if (bVar6 == 0) {
switchD_004bd4bf_caseD_0:
    CVar7 = CURLE_OK;
    if (uStack_38._4_1_ != '\0') {
      CVar7 = CURLE_URL_MALFORMAT;
      CVar4 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*passwdp,0);
      if (CVar4 < CURLUE_UNKNOWN_PART) {
        CVar7 = *(CURLcode *)(&DAT_0056ac64 + (ulong)CVar4 * 4);
      }
    }
  }
  else {
    CVar4 = curl_url_set((data->state).uh,CURLUPART_USER,*userp,0);
    CVar7 = CURLE_URL_MALFORMAT;
    switch(CVar4) {
    case CURLUE_OK:
      goto switchD_004bd4bf_caseD_0;
    case CURLUE_UNSUPPORTED_SCHEME:
      CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      CVar7 = CURLE_LOGIN_DENIED;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  bool user_changed = FALSE;
  bool passwd_changed = FALSE;
  CURLUcode uc;

  if(data->set.use_netrc == CURL_NETRC_REQUIRED && conn->bits.user_passwd) {
    /* ignore user+password in the URL */
    if(*userp) {
      Curl_safefree(*userp);
      user_changed = TRUE;
    }
    if(*passwdp) {
      Curl_safefree(*passwdp);
      passwd_changed = TRUE;
    }
    conn->bits.user_passwd = FALSE; /* disable user+password */
  }

  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    user_changed = TRUE;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    passwd_changed = TRUE;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED &&
      (!*userp || !**userp || !*passwdp || !**passwdp)) {
    bool netrc_user_changed = FALSE;
    bool netrc_passwd_changed = FALSE;
    int ret;

    ret = Curl_parsenetrc(conn->host.name,
                          userp, passwdp,
                          &netrc_user_changed, &netrc_passwd_changed,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
      conn->bits.user_passwd = TRUE; /* enable user+password */

      if(netrc_user_changed) {
        user_changed = TRUE;
      }
      if(netrc_passwd_changed) {
        passwd_changed = TRUE;
      }
    }
  }

  /* for updated strings, we update them in the URL */
  if(user_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, *userp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  if(passwd_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD, *passwdp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  return CURLE_OK;
}